

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DestroyPlatformWindows(void)

{
  ImGuiViewportP **ppIVar1;
  ImVector<ImGuiViewportP_*> *this;
  int i;
  int i_00;
  
  this = &GImGui->Viewports;
  for (i_00 = 0; i_00 < this->Size; i_00 = i_00 + 1) {
    ppIVar1 = ImVector<ImGuiViewportP_*>::operator[](this,i_00);
    DestroyPlatformWindow(*ppIVar1);
  }
  return;
}

Assistant:

void ImGui::DestroyPlatformWindows()
{
    // We call the destroy window on every viewport (including the main viewport, index 0) to give a chance to the backend
    // to clear any data they may have stored in e.g. PlatformUserData, RendererUserData.
    // It is convenient for the platform backend code to store something in the main viewport, in order for e.g. the mouse handling
    // code to operator a consistent manner.
    // It is expected that the backend can handle calls to Renderer_DestroyWindow/Platform_DestroyWindow without
    // crashing if it doesn't have data stored.
    ImGuiContext& g = *GImGui;
    for (int i = 0; i < g.Viewports.Size; i++)
        DestroyPlatformWindow(g.Viewports[i]);
}